

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

DWARFDie __thiscall llvm::DWARFUnit::getSibling(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  pointer pDVar6;
  DWARFDie DVar7;
  
  if (((Die != (DWARFDebugInfoEntry *)0x0) && (uVar1 = Die->Depth, uVar1 != 0)) &&
     (Die->AbbrevDecl != (DWARFAbbreviationDeclaration *)0x0)) {
    uVar2 = getDIEIndex(this,Die);
    uVar3 = (ulong)(uVar2 + 1);
    pDVar6 = (this->DieArray).
             super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->DieArray).
                   super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 3) *
            -0x5555555555555555;
    lVar5 = uVar4 - uVar3;
    if (uVar3 <= uVar4 && lVar5 != 0) {
      pDVar6 = pDVar6 + uVar3;
      do {
        if (pDVar6->Depth == uVar1) goto LAB_00b05a8d;
        pDVar6 = pDVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  this = (DWARFUnit *)0x0;
  pDVar6 = (pointer)0x0;
LAB_00b05a8d:
  DVar7.Die = pDVar6;
  DVar7.U = this;
  return DVar7;
}

Assistant:

DWARFDie DWARFUnit::getSibling(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have siblings.
  if (Depth == 0)
    return DWARFDie();
  // NULL DIEs don't have siblings.
  if (Die->getAbbreviationDeclarationPtr() == nullptr)
    return DWARFDie();

  // Find the next DIE whose depth is the same as the Die's depth.
  for (size_t I = getDIEIndex(Die) + 1, EndIdx = DieArray.size(); I < EndIdx;
       ++I) {
    if (DieArray[I].getDepth() == Depth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}